

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

String * __thiscall asl::File::name(String *__return_storage_ptr__,File *this)

{
  int iVar1;
  int n;
  File *this_local;
  
  iVar1 = asl::String::lastIndexOf(&this->_path,'/');
  asl::String::substring(__return_storage_ptr__,&this->_path,iVar1 + 1);
  return __return_storage_ptr__;
}

Assistant:

String File::name() const
{
	int n = _path.lastIndexOf(SEP);
#ifdef _WIN32
	int m = _path.lastIndexOf('/');
	n = (m > n)? m : n;
#endif
	return _path.substring(n+1);
}